

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompRelationalExpr(xmlXPathParserContextPtr ctxt)

{
  byte bVar1;
  int ch1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  
  xmlXPathCompAdditiveExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar2 = ctxt->cur;
    while ((uVar4 = (ulong)*pbVar2, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
      pbVar2 = pbVar2 + 1;
      ctxt->cur = pbVar2;
    }
    while (((uint)uVar4 | 2) == 0x3e) {
      ch1 = ctxt->comp->last;
      pbVar3 = pbVar2 + 1;
      bVar1 = pbVar2[1];
      ctxt->cur = pbVar3;
      if (bVar1 != 0x3d) goto LAB_001c25ea;
      if (*pbVar3 == 0) goto LAB_001c25ea;
      pbVar3 = pbVar2 + 2;
      while( true ) {
        ctxt->cur = pbVar3;
LAB_001c25ea:
        if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
        pbVar3 = pbVar3 + 1;
      }
      xmlXPathCompAdditiveExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_CMP,(uint)((char)uVar4 == '<'),
                          (uint)(bVar1 != 0x3d),0,(void *)0x0,(void *)0x0);
      pbVar2 = ctxt->cur;
      while ((uVar4 = (ulong)*pbVar2, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0)))
      {
        pbVar2 = pbVar2 + 1;
        ctxt->cur = pbVar2;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompRelationalExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompAdditiveExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '<') || (CUR == '>')) {
	int inf, strict;
	int op1 = ctxt->comp->last;

        if (CUR == '<') inf = 1;
	else inf = 0;
	if (NXT(1) == '=') strict = 0;
	else strict = 1;
	NEXT;
	if (!strict) NEXT;
	SKIP_BLANKS;
        xmlXPathCompAdditiveExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_CMP, op1, ctxt->comp->last, inf, strict);
	SKIP_BLANKS;
    }
}